

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderDrawCallsWhileTFPaused::deinit(GeometryShaderDrawCallsWhileTFPaused *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  int local_1c;
  int i;
  Functions *gl;
  GeometryShaderDrawCallsWhileTFPaused *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_gs_id);
    this->m_gs_id = 0;
  }
  for (local_1c = 0; local_1c < 0xf; local_1c = local_1c + 1) {
    if (this->m_po_ids[local_1c] != 0) {
      (**(code **)(lVar3 + 0x448))(this->m_po_ids[local_1c]);
      this->m_po_ids[local_1c] = 0;
    }
  }
  if (this->m_tfbo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_tfbo_id);
    this->m_tfbo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderDrawCallsWhileTFPaused::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
		m_gs_id = 0;
	}

	for (int i = 0; i < 15 /* All combinations of possible inputs and outputs in GS */; ++i)
	{
		if (m_po_ids[i] != 0)
		{
			gl.deleteProgram(m_po_ids[i]);
			m_po_ids[i] = 0;
		}
	}

	if (m_tfbo_id != 0)
	{
		gl.deleteBuffers(1, &m_tfbo_id);
		m_tfbo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}